

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int excline(char *line,int llen,int lnum)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  uint local_8c;
  KEYMAP *local_78;
  KEYMAP *curmap;
  long lStack_68;
  int bind;
  long nl;
  char *argp;
  char *tmp;
  char *funcp;
  int n;
  int f;
  int c;
  int status;
  line *np;
  line *lp;
  PF fp;
  int lnum_local;
  int llen_local;
  char *line_local;
  
  nl = 0;
  local_78 = (KEYMAP *)0x0;
  np = (line *)0x0;
  fp._0_4_ = lnum;
  fp._4_4_ = llen;
  _lnum_local = (byte *)line;
  if ((macrodef == 0) && (inmacro == 0)) {
    funcp._4_4_ = 0;
    funcp._0_4_ = 1;
    tmp = skipwhite(line);
    if (*tmp == '\0') {
      line_local._4_4_ = 1;
    }
    else if (*tmp == '(') {
      line_local._4_4_ = foundparen(tmp,fp._4_4_,(int)fp);
    }
    else {
      pbVar2 = (byte *)parsetoken(tmp);
      _lnum_local = pbVar2;
      if (*pbVar2 != 0) {
        _lnum_local = pbVar2 + 1;
        *pbVar2 = 0;
        _lnum_local = (byte *)skipwhite((char *)_lnum_local);
        if (((cinfo[*_lnum_local] & 0x20U) != 0) || (*_lnum_local == 0x2d)) {
          nl = (long)_lnum_local;
          _lnum_local = (byte *)parsetoken((char *)_lnum_local);
        }
      }
      if (nl != 0) {
        funcp._4_4_ = 7;
        lStack_68 = strtol((char *)nl,&argp,10);
        if (*argp != '\0') {
          return 0;
        }
        if ((0x7ffffffe < lStack_68) || (lStack_68 < -0x7fffffff)) {
          return 0;
        }
        funcp._0_4_ = (undefined4)lStack_68;
      }
      lp = (line *)name_function(tmp);
      if (lp == (line *)0x0) {
        line_local._4_4_ = dobeep_msgs("Unknown function:",tmp);
      }
      else {
        if ((lp == (line *)bindtokey) || (lp == (line *)unbindtokey)) {
          curmap._4_4_ = 0;
          local_78 = fundamental_mode.p_map;
        }
        else if ((lp == (line *)localbind) || (lp == (line *)localunbind)) {
          curmap._4_4_ = 0;
          local_78 = curbp->b_modes[curbp->b_nmodes]->p_map;
        }
        else if (lp == (line *)redefine_key) {
          curmap._4_4_ = 2;
        }
        else {
          curmap._4_4_ = 1;
        }
        _c = lalloc(0);
        if (_c == (line *)0x0) {
          line_local._4_4_ = 0;
        }
        else {
          maclcur = _c;
          _c->l_bp = _c;
          _c->l_fp = _c;
          while ((*_lnum_local != 0 &&
                 (nl = (long)skipwhite((char *)_lnum_local), *(char *)nl != '\0'))) {
            _lnum_local = (byte *)parsetoken((char *)nl);
            if (*(char *)nl == '\"') {
              nl = nl + 1;
              if (curmap._4_4_ == 0) {
                key.k_count = 0;
              }
              else {
                np = lalloc(((int)_lnum_local - (int)nl) + 1);
                if (np == (line *)0x0) {
                  f = 0;
                  goto LAB_00111aeb;
                }
                np->l_used = 0;
              }
              while( true ) {
                bVar4 = false;
                if (*(char *)nl != '\"') {
                  bVar4 = *(char *)nl != '\0';
                }
                if (!bVar4) break;
                if (*(char *)nl == '\\') {
                  pbVar2 = (byte *)(nl + 1);
                  switch(*(undefined1 *)(nl + 1)) {
                  case 0x30:
                  case 0x31:
                  case 0x32:
                  case 0x33:
                  case 0x34:
                  case 0x35:
                  case 0x36:
                  case 0x37:
                    n = (char)*pbVar2 + -0x30;
                    if ((*(char *)(nl + 2) < '8') && ('/' < *(char *)(nl + 2))) {
                      pbVar2 = (byte *)(nl + 2);
                      n = *(char *)(nl + 2) + -0x30 + n * 8;
                      if ((*(char *)(nl + 3) < '8') && ('/' < *(char *)(nl + 3))) {
                        pbVar2 = (byte *)(nl + 3);
                        n = *(char *)(nl + 3) + -0x30 + n * 8;
                      }
                    }
                    break;
                  default:
                    n = (int)*pbVar2;
                    break;
                  case 0x45:
                  case 0x65:
                    n = 0x1b;
                    break;
                  case 0x46:
                  case 0x66:
                    n = *(char *)(nl + 2) + -0x30;
                    lVar3 = nl + 2;
                    if ((cinfo[*(byte *)(nl + 3)] & 0x20U) != 0) {
                      n = *(char *)(nl + 3) + -0x30 + n * 10;
                      lVar3 = nl + 3;
                    }
                    nl = lVar3;
                    n = n + 0x100;
                    pbVar2 = (byte *)nl;
                    break;
                  case 0x4e:
                  case 0x6e:
                    n = 10;
                    break;
                  case 0x52:
                  case 0x72:
                    n = 0xd;
                    break;
                  case 0x54:
                  case 0x74:
                    n = 9;
                    break;
                  case 0x5e:
                    pbVar2 = (byte *)(nl + 2);
                    local_8c = (uint)*(byte *)(nl + 2);
                    if ((cinfo[local_8c] & 4U) != 0) {
                      local_8c = local_8c - 0x20;
                    }
                    local_8c = local_8c ^ 0x40;
                    n = local_8c;
                  }
                }
                else {
                  n = (int)*(char *)nl;
                  pbVar2 = (byte *)nl;
                }
                nl = (long)pbVar2 + 1;
                if (curmap._4_4_ == 0) {
                  lVar3 = (long)key.k_count;
                  key.k_count = key.k_count + 1;
                  key.k_chars[lVar3] = (KCHAR)n;
                }
                else {
                  iVar1 = np->l_used;
                  np->l_used = iVar1 + 1;
                  np->l_text[iVar1] = (char)n;
                }
              }
              if (*_lnum_local != 0) {
                _lnum_local = _lnum_local + 1;
              }
            }
            else {
              if (*(char *)nl == '\'') {
                nl = nl + 1;
              }
              np = lalloc(((int)_lnum_local - (int)nl) + 1);
              if (np == (line *)0x0) {
                f = 0;
                goto LAB_00111aeb;
              }
              memmove(np->l_text,(void *)nl,(long)((int)_lnum_local - (int)nl));
              np->l_used = np->l_used + -1;
              if (curmap._4_4_ == 0) {
                curmap._4_4_ = 1;
              }
            }
            if (curmap._4_4_ == 0) {
              curmap._4_4_ = 3;
            }
            else if (curmap._4_4_ == 2) {
              np->l_text[np->l_used] = '\0';
              local_78 = name_map(np->l_text);
              if (local_78 == (KEYMAP *)0x0) {
                dobeep_msgs("No such mode:",np->l_text);
                f = 0;
                free(np);
                goto LAB_00111aeb;
              }
              free(np);
              curmap._4_4_ = 0;
            }
            else {
              np->l_fp = _c->l_fp;
              np->l_bp = _c;
              _c->l_fp = np;
              _c = np;
            }
          }
          if (curmap._4_4_ == 1) {
            inmacro = 1;
            maclcur = maclcur->l_fp;
            f = (*(code *)lp)(funcp._4_4_,funcp._0_4_);
            inmacro = 0;
          }
          else if (curmap._4_4_ == 3) {
            if ((lp == (line *)unbindtokey) || (lp == (line *)localunbind)) {
              f = bindkey(&local_78,(char *)0x0,key.k_chars,key.k_count);
            }
            else {
              np->l_text[np->l_used] = '\0';
              f = bindkey(&local_78,np->l_text,key.k_chars,key.k_count);
            }
          }
          else {
            dobeep_msg("Bad args to set key");
            f = 0;
          }
LAB_00111aeb:
          np = maclcur->l_fp;
          while (np != maclcur) {
            _c = np->l_fp;
            free(np);
            np = _c;
          }
          free(np);
          maclhead = (line *)0x0;
          macrodef = 0;
          line_local._4_4_ = f;
        }
      }
    }
  }
  else {
    line_local._4_4_ = dobeep_msg("Not now!");
  }
  return line_local._4_4_;
}

Assistant:

int
excline(char *line, int llen, int lnum)
{
	PF	 fp;
	struct line	*lp, *np;
	int	 status, c, f, n;
	char	*funcp, *tmp;
	char	*argp = NULL;
	long	 nl;
	int	 bind;
	KEYMAP	*curmap = NULL;
#define BINDARG		0  /* this arg is key to bind (local/global set key) */
#define	BINDNO		1  /* not binding or non-quoted BINDARG */
#define BINDNEXT	2  /* next arg " (define-key) */
#define BINDDO		3  /* already found key to bind */
#define BINDEXT		1  /* space for trailing \0 */

	lp = NULL;

	if (macrodef || inmacro)
		return (dobeep_msg("Not now!"));

	f = 0;
	n = 1;
	funcp = skipwhite(line);
	if (*funcp == '\0')
		return (TRUE);	/* No error on blank lines */
	if (*funcp == '(')
		return (foundparen(funcp, llen, lnum));
	line = parsetoken(funcp);
	if (*line != '\0') {
		*line++ = '\0';
		line = skipwhite(line);
		if (ISDIGIT(*line) || *line == '-') {
			argp = line;
			line = parsetoken(line);
		}
	}
	if (argp != NULL) {
		f = FFARG;
		nl = strtol(argp, &tmp, 10);
		if (*tmp != '\0')
			return (FALSE);
		if (nl >= INT_MAX || nl <= INT_MIN)
			return (FALSE);
		n = (int)nl;
	}
	if ((fp = name_function(funcp)) == NULL)
		return (dobeep_msgs("Unknown function:", funcp));

	if (fp == bindtokey || fp == unbindtokey) {
		bind = BINDARG;
		curmap = fundamental_map;
	} else if (fp == localbind || fp == localunbind) {
		bind = BINDARG;
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
	} else if (fp == redefine_key)
		bind = BINDNEXT;
	else
		bind = BINDNO;
	/* Pack away all the args now... */
	if ((np = lalloc(0)) == FALSE)
		return (FALSE);
	np->l_fp = np->l_bp = maclcur = np;
	while (*line != '\0') {
		argp = skipwhite(line);
		if (*argp == '\0')
			break;
		line = parsetoken(argp);
		if (*argp != '"') {
			if (*argp == '\'')
				++argp;
			if ((lp = lalloc((int) (line - argp) + BINDEXT)) ==
			    NULL) {
				status = FALSE;
				goto cleanup;
			}
			bcopy(argp, ltext(lp), (int)(line - argp));
			/* don't count BINDEXT */
			lp->l_used--;
			if (bind == BINDARG)
				bind = BINDNO;
		} else {
			/* quoted strings are special */
			++argp;
			if (bind != BINDARG) {
				lp = lalloc((int)(line - argp) + BINDEXT);
				if (lp == NULL) {
					status = FALSE;
					goto cleanup;
				}
				lp->l_used = 0;
			} else
				key.k_count = 0;
			while (*argp != '"' && *argp != '\0') {
				if (*argp != '\\')
					c = *argp++;
				else {
					switch (*++argp) {
					case 't':
					case 'T':
						c = CCHR('I');
						break;
					case 'n':
					case 'N':
						c = CCHR('J');
						break;
					case 'r':
					case 'R':
						c = CCHR('M');
						break;
					case 'e':
					case 'E':
						c = CCHR('[');
						break;
					case '^':
						/*
						 * split into two statements
						 * due to bug in OSK cpp
						 */
						c = CHARMASK(*++argp);
						c = ISLOWER(c) ?
						    CCHR(TOUPPER(c)) : CCHR(c);
						break;
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
						c = *argp - '0';
						if (argp[1] <= '7' &&
						    argp[1] >= '0') {
							c <<= 3;
							c += *++argp - '0';
							if (argp[1] <= '7' &&
							    argp[1] >= '0') {
								c <<= 3;
								c += *++argp
								    - '0';
							}
						}
						break;
					case 'f':
					case 'F':
						c = *++argp - '0';
						if (ISDIGIT(argp[1])) {
							c *= 10;
							c += *++argp - '0';
						}
						c += KFIRST;
						break;
					default:
						c = CHARMASK(*argp);
						break;
					}
					argp++;
				}
				if (bind == BINDARG)
					key.k_chars[key.k_count++] = c;
				else
					lp->l_text[lp->l_used++] = c;
			}
			if (*line)
				line++;
		}
		switch (bind) {
		case BINDARG:
			bind = BINDDO;
			break;
		case BINDNEXT:
			lp->l_text[lp->l_used] = '\0';
			if ((curmap = name_map(lp->l_text)) == NULL) {
				(void)dobeep_msgs("No such mode:", lp->l_text);
				status = FALSE;
				free(lp);
				goto cleanup;
			}
			free(lp);
			bind = BINDARG;
			break;
		default:
			lp->l_fp = np->l_fp;
			lp->l_bp = np;
			np->l_fp = lp;
			np = lp;
		}
	}
	switch (bind) {
	default:
		(void)dobeep_msg("Bad args to set key");
		status = FALSE;
		break;
	case BINDDO:
		if (fp != unbindtokey && fp != localunbind) {
			lp->l_text[lp->l_used] = '\0';
			status = bindkey(&curmap, lp->l_text, key.k_chars,
			    key.k_count);
		} else
			status = bindkey(&curmap, NULL, key.k_chars,
			    key.k_count);
		break;
	case BINDNO:
		inmacro = TRUE;
		maclcur = maclcur->l_fp;
		status = (*fp)(f, n);
		inmacro = FALSE;
	}
cleanup:
	lp = maclcur->l_fp;
	while (lp != maclcur) {
		np = lp->l_fp;
		free(lp);
		lp = np;
	}
	free(lp);
	maclhead = NULL;
	macrodef = FALSE;
	return (status);
}